

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

http_protocol_version_t find_http_protocol_version(char *sval)

{
  int iVar1;
  char *__s2;
  long lVar2;
  
  if (http_protocol_version[0] != (char *)0x0) {
    lVar2 = 0;
    __s2 = http_protocol_version[0];
    do {
      iVar1 = strncmp(sval,__s2,0x10);
      if (iVar1 == 0) {
        return (http_protocol_version_t)lVar2;
      }
      __s2 = http_protocol_version[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (__s2 != (char *)0x0);
  }
  return INVALID_PROTO;
}

Assistant:

http_protocol_version_t find_http_protocol_version(const char *sval)
{
  http_protocol_version_t result = HTTP10; /* value corresponding to etable[0] */
  int i = 0;
  for (i = 0; http_protocol_version[i] != NULL; ++i, ++result)
    if (!(strncmp(sval, http_protocol_version[i], 16)))
      return result;
  return INVALID_PROTO;
}